

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

int parse_operating_parameters_info(aom_read_bit_buffer *reader,int buffer_delay_length_minus_1)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int in_ESI;
  long in_RDI;
  int low_delay_mode_flag;
  int encoder_buffer_delay;
  int decoder_buffer_delay;
  int buffer_delay_length;
  void *original_error_handler_data;
  int result;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18 [2];
  long local_10;
  int local_4;
  
  local_18[0] = 0;
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  *(int **)(in_RDI + 0x18) = local_18;
  iVar2 = in_ESI + 1;
  local_10 = in_RDI;
  uVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
  if (local_18[0] == -1) {
    fprintf(_stderr,"av1c: Could not read bits for decoder_buffer_delay, value=%d result=%d.\n",
            (ulong)uVar3,0xffffffff);
    local_4 = -1;
  }
  else {
    uVar4 = aom_rb_read_literal((aom_read_bit_buffer *)(ulong)in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffcc);
    if (local_18[0] == -1) {
      fprintf(_stderr,"av1c: Could not read bits for encoder_buffer_delay, value=%d result=%d.\n",
              (ulong)uVar4,0xffffffff);
      local_4 = -1;
    }
    else {
      uVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar2,uVar3));
      if (local_18[0] == -1) {
        fprintf(_stderr,"av1c: Error reading bit for low_delay_mode_flag, value=%d result=%d.\n",
                (ulong)uVar3,0xffffffff);
        local_4 = -1;
      }
      else {
        *(undefined8 *)(local_10 + 0x18) = uVar1;
        local_4 = local_18[0];
      }
    }
  }
  return local_4;
}

Assistant:

static int parse_operating_parameters_info(struct aom_read_bit_buffer *reader,
                                           int buffer_delay_length_minus_1) {
  int result = 0;
  AV1C_PUSH_ERROR_HANDLER_DATA(result);

  const int buffer_delay_length = buffer_delay_length_minus_1 + 1;
  AV1C_READ_BITS_OR_RETURN_ERROR(decoder_buffer_delay, buffer_delay_length);
  AV1C_READ_BITS_OR_RETURN_ERROR(encoder_buffer_delay, buffer_delay_length);
  AV1C_READ_BIT_OR_RETURN_ERROR(low_delay_mode_flag);

  AV1C_POP_ERROR_HANDLER_DATA();
  return result;
}